

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O2

unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>,_true>
__thiscall duckdb::ZSTDStorage::SerializeState(ZSTDStorage *this,ColumnSegment *segment)

{
  CompressedSegmentState *pCVar1;
  _Head_base<0UL,_duckdb::CompressedSegmentState_*,_false> local_18;
  
  local_18._M_head_impl =
       (segment->segment_state).
       super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
       .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl;
  pCVar1 = optional_ptr<duckdb::CompressedSegmentState,_true>::operator->
                     ((optional_ptr<duckdb::CompressedSegmentState,_true> *)&local_18);
  if (pCVar1[0xb]._vptr_CompressedSegmentState == pCVar1[0xc]._vptr_CompressedSegmentState) {
    local_18._M_head_impl = (CompressedSegmentState *)0x0;
  }
  else {
    make_uniq<duckdb::SerializedStringSegmentState,duckdb::vector<long,true>&>
              ((duckdb *)&local_18,(vector<long,_true> *)(pCVar1 + 0xb));
  }
  *(CompressedSegmentState **)this = local_18._M_head_impl;
  return (unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>)
         (unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>)
         this;
}

Assistant:

unique_ptr<ColumnSegmentState> ZSTDStorage::SerializeState(ColumnSegment &segment) {
	auto &state = segment.GetSegmentState()->Cast<UncompressedStringSegmentState>();
	if (state.on_disk_blocks.empty()) {
		// no on-disk blocks - nothing to write
		return nullptr;
	}
	return make_uniq<SerializedStringSegmentState>(state.on_disk_blocks);
}